

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O1

void makeContextCurrentEGL(_GLFWwindow *window)

{
  EGLSurface pvVar1;
  EGLBoolean EVar2;
  EGLint EVar3;
  char *pcVar4;
  char *format;
  
  if (window == (_GLFWwindow *)0x0) {
    EVar2 = (*_glfw.egl.MakeCurrent)
                      (_glfw.egl.display,(EGLSurface)0x0,(EGLSurface)0x0,(EGLContext)0x0);
    if (EVar2 != 0) goto LAB_0012676c;
    EVar3 = (*_glfw.egl.GetError)();
    pcVar4 = getEGLErrorString(EVar3);
    format = "EGL: Failed to clear current context: %s";
  }
  else {
    pvVar1 = (window->context).egl.surface;
    EVar2 = (*_glfw.egl.MakeCurrent)(_glfw.egl.display,pvVar1,pvVar1,(window->context).egl.handle);
    if (EVar2 != 0) {
LAB_0012676c:
      _glfwPlatformSetTls(&_glfw.contextSlot,window);
      return;
    }
    EVar3 = (*_glfw.egl.GetError)();
    pcVar4 = getEGLErrorString(EVar3);
    format = "EGL: Failed to make context current: %s";
  }
  _glfwInputError(0x10008,format,pcVar4);
  return;
}

Assistant:

static void makeContextCurrentEGL(_GLFWwindow* window)
{
    if (window)
    {
        if (!eglMakeCurrent(_glfw.egl.display,
                            window->context.egl.surface,
                            window->context.egl.surface,
                            window->context.egl.handle))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "EGL: Failed to make context current: %s",
                            getEGLErrorString(eglGetError()));
            return;
        }
    }
    else
    {
        if (!eglMakeCurrent(_glfw.egl.display,
                            EGL_NO_SURFACE,
                            EGL_NO_SURFACE,
                            EGL_NO_CONTEXT))
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "EGL: Failed to clear current context: %s",
                            getEGLErrorString(eglGetError()));
            return;
        }
    }

    _glfwPlatformSetTls(&_glfw.contextSlot, window);
}